

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::fixDanglingReferences(QPDF *this,bool force)

{
  bool bVar1;
  pointer pMVar2;
  bool force_local;
  QPDF *this_local;
  
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if ((pMVar2->fixed_dangling_refs & 1U) == 0) {
    bVar1 = resolveXRefTable(this);
    if (!bVar1) {
      QTC::TC("qpdf","QPDF fix dangling triggered xref reconstruction",0);
      resolveXRefTable(this);
    }
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pMVar2->fixed_dangling_refs = true;
  }
  return;
}

Assistant:

void
QPDF::fixDanglingReferences(bool force)
{
    if (m->fixed_dangling_refs) {
        return;
    }
    if (!resolveXRefTable()) {
        QTC::TC("qpdf", "QPDF fix dangling triggered xref reconstruction");
        resolveXRefTable();
    }
    m->fixed_dangling_refs = true;
}